

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

char ** parseUriList(char *text,int *count)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  char local_3b;
  char local_3a;
  undefined1 local_39;
  char *pcStack_38;
  char digits [3];
  char *path;
  char *line;
  char **paths;
  char *prefix;
  int *count_local;
  char *text_local;
  
  line = (char *)0x0;
  *count = 0;
  count_local = (int *)text;
  while (path = strtok((char *)count_local,"\r\n"), path != (char *)0x0) {
    count_local = (int *)0x0;
    if (*path != '#') {
      sVar2 = strlen("file://");
      iVar1 = strncmp(path,"file://",sVar2);
      if (iVar1 == 0) {
        sVar2 = strlen("file://");
        for (path = path + sVar2; *path != '/'; path = path + 1) {
        }
      }
      *count = *count + 1;
      sVar2 = strlen(path);
      pcStack_38 = (char *)calloc(sVar2 + 1,1);
      line = (char *)realloc(line,(long)*count << 3);
      *(char **)(line + (long)(*count + -1) * 8) = pcStack_38;
      for (; *path != '\0'; path = path + 1) {
        if (((*path == '%') && (path[1] != '\0')) && (path[2] != '\0')) {
          local_3b = path[1];
          local_3a = path[2];
          local_39 = 0;
          lVar3 = strtol(&local_3b,(char **)0x0,0x10);
          *pcStack_38 = (char)lVar3;
          path = path + 2;
        }
        else {
          *pcStack_38 = *path;
        }
        pcStack_38 = pcStack_38 + 1;
      }
    }
  }
  return (char **)line;
}

Assistant:

static char** parseUriList(char* text, int* count)
{
    const char* prefix = "file://";
    char** paths = NULL;
    char* line;

    *count = 0;

    while ((line = strtok(text, "\r\n")))
    {
        text = NULL;

        if (line[0] == '#')
            continue;

        if (strncmp(line, prefix, strlen(prefix)) == 0)
        {
            line += strlen(prefix);
            // TODO: Validate hostname
            while (*line != '/')
                line++;
        }

        (*count)++;

        char* path = calloc(strlen(line) + 1, 1);
        paths = realloc(paths, *count * sizeof(char*));
        paths[*count - 1] = path;

        while (*line)
        {
            if (line[0] == '%' && line[1] && line[2])
            {
                const char digits[3] = { line[1], line[2], '\0' };
                *path = strtol(digits, NULL, 16);
                line += 2;
            }
            else
                *path = *line;

            path++;
            line++;
        }
    }

    return paths;
}